

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

CFGNode * dxil_spv::CFGStructurizer::scan_plain_continue_block(CFGNode *node)

{
  CFGNode *pCVar1;
  bool bVar2;
  CFGNode *other;
  
  pCVar1 = node;
  while( true ) {
    other = pCVar1;
    if (other->succ_back_edge != (CFGNode *)0x0 && other->succ_back_edge != other) {
      return other;
    }
    bVar2 = CFGNode::dominates(node,other);
    if (!bVar2) {
      return other;
    }
    if (other->succ_back_edge != (CFGNode *)0x0) {
      return other;
    }
    if (other->pred_back_edge != (CFGNode *)0x0) break;
    pCVar1 = other->immediate_post_dominator;
    if (pCVar1 == (CFGNode *)0x0) {
      return other;
    }
    if (pCVar1 == other) {
      return other;
    }
  }
  return other;
}

Assistant:

const CFGNode *CFGStructurizer::scan_plain_continue_block(const CFGNode *node)
{
	auto *base_node = node;
	while (!block_is_plain_continue(node) &&
	       base_node->dominates(node) &&
	       !node->succ_back_edge &&
	       !node->pred_back_edge &&
	       node->immediate_post_dominator &&
	       node->immediate_post_dominator != node)
	{
		node = node->immediate_post_dominator;
	}

	return node;
}